

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

void slang::
     function_ref<void(char,unsigned_long,unsigned_long,slang::ast::SFormat::FormatOptions_const&)>
     ::
     callback_fn<slang::ast::FmtHelpers::formatArgs[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Scope_const&,slang::ast::EvalContext&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>const&,bool)::__1>
               (intptr_t callable,char params,unsigned_long params_1,unsigned_long params_2,
               FormatOptions *params_3)

{
  FormatOptions *in_stack_000000e0;
  size_t in_stack_000000e8;
  size_t in_stack_000000f0;
  char in_stack_000000ff;
  anon_class_56_7_22752c04 *in_stack_00000100;
  
  ast::FmtHelpers::formatArgs::anon_class_56_7_22752c04::operator()
            (in_stack_00000100,in_stack_000000ff,in_stack_000000f0,in_stack_000000e8,
             in_stack_000000e0);
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }